

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.c
# Opt level: O3

void yp_usleep(int usec)

{
  timespec request;
  timespec local_10;
  
  local_10.tv_sec = (__time_t)(usec / 1000000);
  local_10.tv_nsec = (local_10.tv_sec * -1000000 + (long)usec) * 1000;
  nanosleep(&local_10,(timespec *)0x0);
  return;
}

Assistant:

void yp_usleep(int usec)
{
#if defined(HAVE_NANOSLEEP)
  // nanosleepが利用可能
  struct timespec request;
  request.tv_sec = usec / 1000000;
  request.tv_nsec = (usec - request.tv_sec * 1000000) * 1000;

  nanosleep(&request, NULL);
#elif defined(__MINGW32__)
  // MinGWのusleepには1ms以下切り捨ての問題があるためWindows環境ではWinAPIのSleepを使う
  // 1ms以下は切り上げ
  Sleep((usec + 999) / 1000);
#else
  // 古いシステム用
  usleep(usec);
#endif  // defined(HAVE_NANOSLEEP)
}